

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

double Catch::Benchmark::Detail::weighted_average_quantile(int k,int q,iterator first,iterator last)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  double dVar2;
  double dVar3;
  
  dVar2 = (double)((long)k * (((long)last._M_current - (long)first._M_current >> 3) + -1)) /
          (double)q;
  dVar3 = dVar2 - (double)(int)dVar2;
  _Var1._M_current = first._M_current + (int)dVar2;
  std::nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             first._M_current,_Var1,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             last._M_current);
  dVar2 = *_Var1._M_current;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    _Var1 = std::
            __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (_Var1._M_current + 1,last._M_current);
    dVar2 = dVar3 * (*_Var1._M_current - dVar2) + dVar2;
  }
  return dVar2;
}

Assistant:

double weighted_average_quantile(int k, int q, std::vector<double>::iterator first, std::vector<double>::iterator last) {
                auto count = last - first;
                double idx = (count - 1) * k / static_cast<double>(q);
                int j = static_cast<int>(idx);
                double g = idx - j;
                std::nth_element(first, first + j, last);
                auto xj = first[j];
                if (g == 0) return xj;

                auto xj1 = *std::min_element(first + (j + 1), last);
                return xj + g * (xj1 - xj);
            }